

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

QDebug operator<<(QDebug d,QMetaType m)

{
  int *piVar1;
  Stream *pSVar2;
  QDebug *pQVar3;
  long in_RDX;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebugStateSaver local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_28,(QDebug *)m.d_ptr);
  *(undefined1 *)(*(long *)m.d_ptr + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)m.d_ptr,"QMetaType(");
  if (in_RDX == 0) {
    t = (char *)0x0;
  }
  else {
    t = *(char **)(in_RDX + 0x18);
  }
  pQVar3 = QDebug::operator<<(pQVar3,t);
  pQVar3 = QDebug::operator<<(pQVar3,")");
  pSVar2 = pQVar3->stream;
  ((d.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar2;
  piVar1 = &pSVar2->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug d, QMetaType m)
{
    const QDebugStateSaver saver(d);
    return d.nospace() << "QMetaType(" << m.name() << ")";
}